

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall
Commands::command_handler_register::Handle
          (command_handler_register *this,string *command,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,Command_Source *from,int alias_depth)

{
  Command_Source *pCVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pvVar8;
  ulong uVar9;
  pointer ppVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer ppVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  pointer ppVar12;
  size_type sVar13;
  size_type sVar14;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  byte local_36e;
  byte local_2e1;
  allocator<char> local_299;
  string local_298;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  _Self local_210;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  _Self local_1c0;
  int local_1b8;
  uint local_1b4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  _Stack_1b0;
  int access_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_1a8;
  iterator admin_result_1;
  undefined1 local_198 [7];
  AdminLevel admin_req_1;
  unsigned_long local_178;
  undefined1 local_170 [8];
  string prefix;
  _Self local_148;
  const_iterator handler;
  const_iterator match;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_118;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_110;
  const_iterator alias_result;
  string local_100;
  string local_e0;
  uint local_bc;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  _Stack_b8;
  int access;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_b0;
  iterator admin_result;
  const_iterator cStack_a0;
  AdminLevel admin_req;
  _Self local_98;
  const_iterator command_result;
  allocator<char> local_79;
  string local_78;
  string local_58;
  int local_34;
  Command_Source *pCStack_30;
  int alias_depth_local;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  string *command_local;
  command_handler_register *this_local;
  
  local_34 = alias_depth;
  pCStack_30 = from;
  from_local = (Command_Source *)arguments;
  arguments_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)command;
  command_local = (string *)this;
  uVar6 = std::__cxx11::string::empty();
  pCVar1 = pCStack_30;
  if ((uVar6 & 1) == 0) {
    if (local_34 < 0x65) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
           ::find(&this->handlers,command);
      cStack_a0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                  ::end(&this->handlers);
      bVar2 = std::operator!=(&local_98,&stack0xffffffffffffff60);
      bVar3 = false;
      if (bVar2) {
        ppVar12 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                  ::operator->(&local_98);
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&(ppVar12->second).info.arguments);
        sVar14 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)from_local);
        bVar3 = sVar13 <= sVar14;
      }
      if (bVar3) {
        admin_result.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
        ._M_cur._7_1_ = 4;
        iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
        local_b0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     *)(CONCAT44(extraout_var_00,iVar5) + 0x1f0),command);
        iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
        _Stack_b8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    *)(CONCAT44(extraout_var_01,iVar5) + 0x1f0));
        bVar3 = std::__detail::operator!=(&local_b0,&stack0xffffffffffffff48);
        if (bVar3) {
          ppVar11 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                                  *)&local_b0);
          iVar5 = util::variant::operator_cast_to_int(&ppVar11->second);
          admin_result.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur._7_1_ = (byte)iVar5;
        }
        ppVar12 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                  ::operator->(&local_98);
        if (((ppVar12->second).info.duty_restrict & 1U) == 0) {
          iVar5 = (**pCStack_30->_vptr_Command_Source)();
          local_2e1 = (byte)iVar5;
        }
        else {
          iVar5 = (*pCStack_30->_vptr_Command_Source[1])();
          local_2e1 = (byte)iVar5;
        }
        local_bc = (uint)local_2e1;
        if ((local_bc <
             admin_result.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
             ._M_cur._7_1_) ||
           ((ppVar12 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                       ::operator->(&local_98), ((ppVar12->second).info.require_character & 1U) != 0
            && (iVar5 = (*pCStack_30->_vptr_Command_Source[3])(),
               CONCAT44(extraout_var_02,iVar5) == 0)))) {
          pCVar1 = pCStack_30;
          iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"unknown_command",
                     (allocator<char> *)
                     ((long)&alias_result.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 7));
          I18N::Format<>(&local_e0,(I18N *)(CONCAT44(extraout_var_03,iVar5) + 0x490),&local_100);
          (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&alias_result.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 7));
          this_local._7_1_ = 0;
        }
        else {
          ppVar12 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                    ::operator->(&local_98);
          std::
          function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
          ::operator()(&(ppVar12->second).f,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)from_local,pCStack_30);
          this_local._7_1_ = 1;
        }
      }
      else {
        local_110._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&this->aliases,command);
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->aliases);
        bVar3 = std::__detail::operator!=(&local_110,&local_118);
        if (bVar3) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                 *)&local_110);
          std::__cxx11::string::string((string *)&match,(string *)&pvVar8->second);
          this_local._7_1_ =
               Handle(this,(string *)&match,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)from_local,pCStack_30,local_34 + 1);
          std::__cxx11::string::~string((string *)&match);
        }
        else {
          handler = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                    ::end(&this->handlers);
          local_148._M_node =
               (_Base_ptr)
               std::
               cbegin<std::map<std::__cxx11::string,Commands::command_handler,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>>
                         (&this->handlers);
          while( true ) {
            prefix.field_2._8_8_ =
                 std::
                 cend<std::map<std::__cxx11::string,Commands::command_handler,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>>
                           (&this->handlers);
            bVar3 = std::operator!=(&local_148,(_Self *)((long)&prefix.field_2 + 8));
            if (!bVar3) break;
            uVar6 = std::__cxx11::string::length();
            ppVar12 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                      ::operator->(&local_148);
            if ((ppVar12->second).info.partial_min_chars <= uVar6) {
              uVar6 = std::__cxx11::string::length();
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
              ::operator->(&local_148);
              uVar9 = std::__cxx11::string::length();
              if (uVar6 < uVar9) {
                ppVar12 = std::
                          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                          ::operator->(&local_148);
                local_178 = std::__cxx11::string::length();
                ppVar10 = std::
                          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                          ::operator->(&local_148);
                std::max<unsigned_long>(&local_178,&(ppVar10->second).info.partial_min_chars);
                std::__cxx11::string::substr((ulong)local_170,(ulong)&ppVar12->second);
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)local_198,(ulong)command);
                _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_198,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_170);
                std::__cxx11::string::~string((string *)local_198);
                if (_Var4) {
                  admin_result_1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                  ._M_cur._7_1_ = 4;
                  iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
                  ppVar12 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                            ::operator->(&local_148);
                  local_1a8._M_cur =
                       (__node_type *)
                       std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)(CONCAT44(extraout_var_04,iVar5) + 0x1f0),
                              (key_type *)&ppVar12->second);
                  iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
                  _Stack_1b0._M_cur =
                       (__node_type *)
                       std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              *)(CONCAT44(extraout_var_05,iVar5) + 0x1f0));
                  bVar3 = std::__detail::operator!=(&local_1a8,&stack0xfffffffffffffe50);
                  if (bVar3) {
                    ppVar11 = std::__detail::
                              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                                            *)&local_1a8);
                    iVar5 = util::variant::operator_cast_to_int(&ppVar11->second);
                    admin_result_1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                    ._M_cur._7_1_ = (byte)iVar5;
                  }
                  ppVar12 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                            ::operator->(&local_148);
                  if (((ppVar12->second).info.duty_restrict & 1U) == 0) {
                    iVar5 = (**pCStack_30->_vptr_Command_Source)();
                    local_36e = (byte)iVar5;
                  }
                  else {
                    iVar5 = (*pCStack_30->_vptr_Command_Source[1])();
                    local_36e = (byte)iVar5;
                  }
                  local_1b4 = (uint)local_36e;
                  if ((local_1b4 <
                       admin_result_1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                       ._M_cur._7_1_) ||
                     ((ppVar12 = std::
                                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                                 ::operator->(&local_148),
                      ((ppVar12->second).info.require_character & 1U) != 0 &&
                      (iVar5 = (*pCStack_30->_vptr_Command_Source[3])(),
                      CONCAT44(extraout_var_06,iVar5) == 0)))) {
                    local_1b8 = 4;
                  }
                  else {
                    local_1c0._M_node =
                         (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                         ::end(&this->handlers);
                    bVar3 = std::operator!=(&handler,&local_1c0);
                    pCVar1 = pCStack_30;
                    if (!bVar3) {
                      handler._M_node = local_148._M_node;
                      goto LAB_0013ea25;
                    }
                    iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_200,"unknown_command",&local_201);
                    I18N::Format<>(&local_1e0,(I18N *)(CONCAT44(extraout_var_07,iVar5) + 0x490),
                                   &local_200);
                    (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_1e0);
                    std::__cxx11::string::~string((string *)&local_1e0);
                    std::__cxx11::string::~string((string *)&local_200);
                    std::allocator<char>::~allocator(&local_201);
                    this_local._7_1_ = 0;
                    local_1b8 = 1;
                  }
                }
                else {
LAB_0013ea25:
                  local_1b8 = 0;
                }
                std::__cxx11::string::~string((string *)local_170);
                if ((local_1b8 != 0) && (local_1b8 == 1)) goto LAB_0013ed33;
              }
            }
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
            ::operator++(&local_148);
          }
          local_210._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
               ::end(&this->handlers);
          bVar3 = std::operator!=(&handler,&local_210);
          pCVar1 = pCStack_30;
          if (bVar3) {
            ppVar12 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                      ::operator->(&handler);
            sVar13 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&(ppVar12->second).info.arguments);
            sVar14 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)from_local);
            pCVar1 = pCStack_30;
            if (sVar14 < sVar13) {
              iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,"command_not_enough_arguments",&local_251);
              I18N::Format<>(&local_230,(I18N *)(CONCAT44(extraout_var_08,iVar5) + 0x490),&local_250
                            );
              (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator(&local_251);
              this_local._7_1_ = 0;
            }
            else {
              ppVar12 = std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>
                        ::operator->(&handler);
              std::
              function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
              ::operator()(&(ppVar12->second).f,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)from_local,pCStack_30);
              this_local._7_1_ = 1;
            }
          }
          else {
            iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_298,"unknown_command",&local_299);
            I18N::Format<>(&local_278,(I18N *)(CONCAT44(extraout_var_09,iVar5) + 0x490),&local_298);
            (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::allocator<char>::~allocator(&local_299);
            this_local._7_1_ = 0;
          }
        }
      }
    }
    else {
      uVar7 = std::__cxx11::string::c_str();
      Console::Wrn("Command alias nested too deeply or infinitely recursive: %s",uVar7);
      this_local._7_1_ = 0;
    }
  }
  else {
    iVar5 = (*pCStack_30->_vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"unknown_command",&local_79);
    I18N::Format<>(&local_58,(I18N *)(CONCAT44(extraout_var,iVar5) + 0x490),&local_78);
    (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    this_local._7_1_ = 0;
  }
LAB_0013ed33:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool command_handler_register::Handle(std::string command, const std::vector<std::string>& arguments, Command_Source* from, int alias_depth) const
{
	if (command.empty())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return false;
	}

	if (alias_depth > 100)
	{
		Console::Wrn("Command alias nested too deeply or infinitely recursive: %s", command.c_str());
		return false;
	}

	auto command_result = handlers.find(command);

	if (command_result != handlers.end() && command_result->second.info.arguments.size() <= arguments.size())
	{
		AdminLevel admin_req = ADMIN_HGM;
		auto admin_result = from->SourceWorld()->admin_config.find(command);

		if (admin_result != from->SourceWorld()->admin_config.end())
			admin_req = AdminLevel(int(admin_result->second));

		int access = command_result->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

		if (access < admin_req || (command_result->second.info.require_character && !from->SourceCharacter()))
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
			return false;
		}

		command_result->second.f(arguments, from);
		return true;
	}
	else
	{
		auto alias_result = aliases.find(command);

		if (alias_result != aliases.end())
		{
			return this->Handle(alias_result->second, arguments, from, alias_depth + 1);
		}

		auto match = handlers.end();

		UTIL_CIFOREACH(handlers, handler)
		{
			if (command.length() < handler->second.info.partial_min_chars
			 || command.length() >= handler->second.info.name.length())
				continue;

			std::string prefix = handler->second.info.name.substr(0, std::max(command.length(), handler->second.info.partial_min_chars));

			if (command.substr(0, prefix.length()) == prefix)
			{
				AdminLevel admin_req = ADMIN_HGM;
				auto admin_result = from->SourceWorld()->admin_config.find(handler->second.info.name);

				if (admin_result != from->SourceWorld()->admin_config.end())
					admin_req = AdminLevel(int(admin_result->second));

				int access = handler->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

				if (access < admin_req || (handler->second.info.require_character && !from->SourceCharacter()))
					continue;

				// Ambiguous abbreviation
				if (match != handlers.end())
				{
					from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
					return false;
				}

				match = handler;
			}
		}

		if (match != handlers.end())
		{
			if (match->second.info.arguments.size() > arguments.size())
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_not_enough_arguments"));
				return false;
			}

			match->second.f(arguments, from);
			return true;
		}
	}

	from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
	return false;
}